

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::twosided_exponential_dist<long_double>>
               (twosided_exponential_dist<long_double> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  AssertionHandler *this;
  twosided_exponential_dist<long_double> *in_RDI;
  AssertionHandler catchAssertionHandler;
  twosided_exponential_dist<long_double> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd98;
  undefined2 in_stack_fffffffffffffd9c;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  char *in_stack_fffffffffffffda0;
  AssertionHandler *this_00;
  StringRef *macroName;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  size_type in_stack_fffffffffffffdc0;
  param_type *in_stack_fffffffffffffdc8;
  AssertionHandler *in_stack_fffffffffffffdd0;
  param_type *in_stack_fffffffffffffdf8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe00;
  twosided_exponential_dist<long_double> local_1c8 [2];
  stringstream local_1a0 [16];
  StringRef local_190 [23];
  param_type local_18;
  twosided_exponential_dist<long_double> *local_8;
  
  local_8 = in_RDI;
  trng::twosided_exponential_dist<long_double>::param_type::param_type(&local_18);
  std::__cxx11::stringstream::stringstream(local_1a0);
  macroName = local_190;
  this = (AssertionHandler *)trng::twosided_exponential_dist<long_double>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8);
  trng::operator>>(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  trng::twosided_exponential_dist<long_double>::twosided_exponential_dist(local_1c8,&local_18);
  operator____catch_sr
            (in_stack_fffffffffffffda0,
             CONCAT17(in_stack_fffffffffffffd9f,
                      CONCAT16(in_stack_fffffffffffffd9e,
                               CONCAT24(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))));
  this_00 = (AssertionHandler *)&stack0xfffffffffffffdd0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffffdbf;
  capturedExpression.m_start._0_7_ = in_stack_fffffffffffffdb8;
  capturedExpression.m_size = in_stack_fffffffffffffdc0;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             CONCAT13(in_stack_fffffffffffffd9f,
                      CONCAT12(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd9c)));
  bVar1 = trng::operator==((twosided_exponential_dist<long_double> *)this_00,
                           (twosided_exponential_dist<long_double> *)
                           CONCAT17(in_stack_fffffffffffffd9f,
                                    CONCAT16(in_stack_fffffffffffffd9e,
                                             CONCAT24(in_stack_fffffffffffffd9c,
                                                      in_stack_fffffffffffffd98))));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT24(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)))
             ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffdd0,(ExprLhs<bool> *)in_stack_fffffffffffffdc8);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}